

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Vec_Int_t * Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar2;
  int i;
  int i_00;
  
  p_00 = Vec_IntDup(vInit);
  iVar1 = (p->vCis).nSize;
  if (vInit->nSize != iVar1 - (p->vPis).nSize) {
    __assert_fail("Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                  ,0x365,"Vec_Int_t *Wlc_ReduceMarkedInitVec(Wlc_Ntk_t *, Vec_Int_t *)");
  }
  i_00 = 0;
  for (i = 0; i < iVar1; i = i + 1) {
    pWVar2 = Wlc_NtkCi(p,i);
    if ((char)*(ushort *)pWVar2 < '\0' && (*(ushort *)pWVar2 & 0x3f) != 1) {
      iVar1 = Vec_IntEntry(vInit,i - (p->vPis).nSize);
      Vec_IntWriteEntry(p_00,i_00,iVar1);
      i_00 = i_00 + 1;
    }
    iVar1 = (p->vCis).nSize;
  }
  if (i_00 <= p_00->nSize) {
    p_00->nSize = i_00;
    return p_00;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Wlc_ReduceMarkedInitVec( Wlc_Ntk_t * p, Vec_Int_t * vInit )
{
    Vec_Int_t * vInitNew = Vec_IntDup( vInit );
    Wlc_Obj_t * pObj; int i, k = 0;
    assert( Vec_IntSize(vInit) == Wlc_NtkCiNum(p) - Wlc_NtkPiNum(p) );
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !Wlc_ObjIsPi(pObj) && pObj->Mark )
            Vec_IntWriteEntry( vInitNew, k++, Vec_IntEntry(vInit, i - Wlc_NtkPiNum(p)) );
    Vec_IntShrink( vInitNew, k );
    return vInitNew;
}